

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O2

bool __thiscall
cbtSingleContactCallback::process(cbtSingleContactCallback *this,cbtBroadphaseProxy *proxy)

{
  cbtCollisionObject *pcVar1;
  cbtDispatcher *pcVar2;
  char cVar3;
  int iVar4;
  undefined4 extraout_var;
  cbtCollisionObjectWrapper ob1;
  cbtCollisionObjectWrapper ob0;
  cbtBridgedManifoldResult contactPointResult;
  long *plVar5;
  
  pcVar1 = (cbtCollisionObject *)proxy->m_clientObject;
  if (pcVar1 != this->m_collisionObject) {
    cVar3 = (**(code **)(*(long *)this->m_resultCallback + 0x10))
                      (this->m_resultCallback,pcVar1->m_broadphaseHandle);
    if (cVar3 != '\0') {
      ob0.m_collisionObject = this->m_collisionObject;
      ob0.m_shape = (ob0.m_collisionObject)->m_collisionShape;
      ob0.m_parent = (cbtCollisionObjectWrapper *)0x0;
      ob0.m_worldTransform = &(ob0.m_collisionObject)->m_worldTransform;
      ob0.m_partId = -1;
      ob0.m_index = -1;
      ob1.m_shape = pcVar1->m_collisionShape;
      ob1.m_parent = (cbtCollisionObjectWrapper *)0x0;
      ob1.m_worldTransform = &pcVar1->m_worldTransform;
      ob1.m_partId = -1;
      ob1.m_index = -1;
      ob1.m_collisionObject = pcVar1;
      iVar4 = (*this->m_world->m_dispatcher1->_vptr_cbtDispatcher[2])();
      plVar5 = (long *)CONCAT44(extraout_var,iVar4);
      if (plVar5 != (long *)0x0) {
        cbtBridgedManifoldResult::cbtBridgedManifoldResult
                  (&contactPointResult,&ob0,&ob1,this->m_resultCallback);
        (**(code **)(*plVar5 + 0x10))
                  (plVar5,&ob0,&ob1,&this->m_world->m_dispatchInfo,&contactPointResult);
        (**(code **)*plVar5)(plVar5);
        pcVar2 = this->m_world->m_dispatcher1;
        (*pcVar2->_vptr_cbtDispatcher[0xf])(pcVar2,plVar5);
      }
    }
  }
  return true;
}

Assistant:

virtual bool process(const cbtBroadphaseProxy* proxy)
	{
		cbtCollisionObject* collisionObject = (cbtCollisionObject*)proxy->m_clientObject;
		if (collisionObject == m_collisionObject)
			return true;

		//only perform raycast if filterMask matches
		if (m_resultCallback.needsCollision(collisionObject->getBroadphaseHandle()))
		{
			cbtCollisionObjectWrapper ob0(0, m_collisionObject->getCollisionShape(), m_collisionObject, m_collisionObject->getWorldTransform(), -1, -1);
			cbtCollisionObjectWrapper ob1(0, collisionObject->getCollisionShape(), collisionObject, collisionObject->getWorldTransform(), -1, -1);

			cbtCollisionAlgorithm* algorithm = m_world->getDispatcher()->findAlgorithm(&ob0, &ob1, 0, BT_CLOSEST_POINT_ALGORITHMS);
			if (algorithm)
			{
				cbtBridgedManifoldResult contactPointResult(&ob0, &ob1, m_resultCallback);
				//discrete collision detection query

				algorithm->processCollision(&ob0, &ob1, m_world->getDispatchInfo(), &contactPointResult);

				algorithm->~cbtCollisionAlgorithm();
				m_world->getDispatcher()->freeCollisionAlgorithm(algorithm);
			}
		}
		return true;
	}